

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileUtilityTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileUtilityTargetGenerator::WriteRuleFiles(cmMakefileUtilityTargetGenerator *this)

{
  undefined1 *puVar1;
  cmGeneratedFileStream *pcVar2;
  cmMakefile *this_00;
  cmGlobalUnixMakefileGenerator3 *pcVar3;
  cmLocalUnixMakefileGenerator3 *pcVar4;
  cmGeneratorTarget *pcVar5;
  pointer pcVar6;
  bool bVar7;
  Encoding EVar8;
  string *psVar9;
  ostream *poVar10;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar11;
  char *pcVar12;
  long lVar13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string dependTimestamp;
  string dependFile;
  cmGeneratedFileStream depFileStream;
  
  cmMakefileTargetGenerator::CreateRuleFile(&this->super_cmMakefileTargetGenerator);
  pcVar2 = (this->super_cmMakefileTargetGenerator).BuildFileStream._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar2,"# Utility rule file for ",0x18);
  psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pcVar2,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,".\n\n",3);
  this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  puVar1 = &depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            field_0x10;
  depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream = (_func_int **)puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&depFileStream,"CMAKE_MAKE_INCLUDE_FROM_ROOT","");
  bVar7 = cmMakefile::IsOn(this_00,(string *)&depFileStream);
  pcVar12 = "";
  if (bVar7) {
    pcVar12 = "$(CMAKE_BINARY_DIR)/";
  }
  if (depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
      _vptr_basic_ostream != (_func_int **)puVar1) {
    operator_delete(depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _16_8_ + 1);
  }
  depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (this->super_cmMakefileTargetGenerator).TargetBuildDirectoryFull._M_dataplus._M_p;
  depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream =
       (_func_int **)
       (this->super_cmMakefileTargetGenerator).TargetBuildDirectoryFull._M_string_length;
  depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0x15;
  depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
       anon_var_dwarf_174cdbd;
  views._M_len = 2;
  views._M_array = (iterator)&depFileStream;
  cmCatViews_abi_cxx11_(&dependFile,views);
  pcVar2 = (this->super_cmMakefileTargetGenerator).BuildFileStream._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar2,"# Include any custom commands dependencies for this target.\n",0x3c)
  ;
  pcVar3 = (this->super_cmMakefileTargetGenerator).GlobalGenerator;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pcVar2,(pcVar3->IncludeDirective)._M_dataplus._M_p,
                       (pcVar3->IncludeDirective)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
  lVar13 = 0x14;
  if (!bVar7) {
    lVar13 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,lVar13);
  cmOutputConverter::MaybeRelativeToTopBinDir
            (&dependTimestamp,
             &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
              super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &dependFile);
  cmSystemTools::ConvertToOutputPath((string *)&depFileStream,&dependTimestamp);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,(char *)depFileStream.super_ofstream.
                                       super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream,
                       depFileStream.super_ofstream.
                       super_basic_ostream<char,_std::char_traits<char>_>._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n\n",2);
  if (depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
      _vptr_basic_ostream != (_func_int **)puVar1) {
    operator_delete(depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dependTimestamp._M_dataplus._M_p != &dependTimestamp.field_2) {
    operator_delete(dependTimestamp._M_dataplus._M_p,
                    dependTimestamp.field_2._M_allocated_capacity + 1);
  }
  bVar7 = cmsys::SystemTools::FileExists(&dependFile);
  if (!bVar7) {
    EVar8 = (*(((this->super_cmMakefileTargetGenerator).GlobalGenerator)->
              super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream(&depFileStream,&dependFile,false,EVar8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&depFileStream,"# Empty custom commands generated dependencies file for ",
               0x38);
    psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&depFileStream,(psVar9->_M_dataplus)._M_p,
                         psVar9->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"# This may be replaced when dependencies are built.\n",0x34);
    cmGeneratedFileStream::~cmGeneratedFileStream(&depFileStream);
  }
  depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (this->super_cmMakefileTargetGenerator).TargetBuildDirectoryFull._M_dataplus._M_p;
  depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream =
       (_func_int **)
       (this->super_cmMakefileTargetGenerator).TargetBuildDirectoryFull._M_string_length;
  depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0x13;
  depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
       anon_var_dwarf_1892f7a;
  views_00._M_len = 2;
  views_00._M_array = (iterator)&depFileStream;
  cmCatViews_abi_cxx11_(&dependTimestamp,views_00);
  bVar7 = cmsys::SystemTools::FileExists(&dependTimestamp);
  if (!bVar7) {
    EVar8 = (*(((this->super_cmMakefileTargetGenerator).GlobalGenerator)->
              super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream(&depFileStream,&dependTimestamp,false,EVar8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&depFileStream,"# CMAKE generated file: DO NOT EDIT!\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&depFileStream,
               "# Timestamp file for custom commands dependencies management for ",0x41);
    psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&depFileStream,(psVar9->_M_dataplus)._M_p,
                         psVar9->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,".\n",2);
    cmGeneratedFileStream::~cmGeneratedFileStream(&depFileStream);
  }
  if ((this->super_cmMakefileTargetGenerator).NoRuleMessages == false) {
    pcVar2 = (this->super_cmMakefileTargetGenerator).BuildFileStream._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar2,"# Include the progress variables for this target.\n",0x32);
    pcVar3 = (this->super_cmMakefileTargetGenerator).GlobalGenerator;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pcVar2,(pcVar3->IncludeDirective)._M_dataplus._M_p,
                         (pcVar3->IncludeDirective)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,lVar13);
    cmOutputConverter::MaybeRelativeToTopBinDir
              ((string *)&commands,
               &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               &(this->super_cmMakefileTargetGenerator).ProgressFileNameFull);
    cmSystemTools::ConvertToOutputPath((string *)&depFileStream,(string *)&commands);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)depFileStream.super_ofstream.
                                         super_basic_ostream<char,_std::char_traits<char>_>.
                                         _vptr_basic_ostream,
                         depFileStream.super_ofstream.
                         super_basic_ostream<char,_std::char_traits<char>_>._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n\n",2);
    if (depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
        _vptr_basic_ostream != (_func_int **)puVar1) {
      operator_delete(depFileStream.super_ofstream.
                      super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                      depFileStream.super_ofstream.
                      super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
    }
    if (commands.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((commands.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
  }
  cmMakefileTargetGenerator::WriteTargetBuildRules(&this->super_cmMakefileTargetGenerator);
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar4 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pvVar11 = cmGeneratorTarget::GetPreBuildCommands
                      ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
  cmLocalUnixMakefileGenerator3::AppendCustomDepends(pcVar4,&depends,pvVar11);
  pcVar4 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pvVar11 = cmGeneratorTarget::GetPostBuildCommands
                      ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
  cmLocalUnixMakefileGenerator3::AppendCustomDepends(pcVar4,&depends,pvVar11);
  pcVar4 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pvVar11 = cmGeneratorTarget::GetPreBuildCommands
                      ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
  pcVar5 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  psVar9 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  cmLocalUnixMakefileGenerator3::AppendCustomCommands(pcVar4,&commands,pvVar11,pcVar5,psVar9);
  cmMakefileTargetGenerator::DriveCustomCommands(&this->super_cmMakefileTargetGenerator,&depends);
  pcVar4 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pvVar11 = cmGeneratorTarget::GetPostBuildCommands
                      ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
  pcVar5 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  psVar9 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  cmLocalUnixMakefileGenerator3::AppendCustomCommands(pcVar4,&commands,pvVar11,pcVar5,psVar9);
  cmMakefileTargetGenerator::AppendTargetDepends
            (&this->super_cmMakefileTargetGenerator,&depends,false);
  cmLocalUnixMakefileGenerator3::AppendRuleDepend
            ((this->super_cmMakefileTargetGenerator).LocalGenerator,&depends,
             (this->super_cmMakefileTargetGenerator).BuildFileNameFull._M_dataplus._M_p);
  if ((depends.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       depends.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pcVar3 = (this->super_cmMakefileTargetGenerator).GlobalGenerator;
    pcVar6 = (pcVar3->EmptyRuleHackDepends)._M_dataplus._M_p;
    depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
    _vptr_basic_ostream = (_func_int **)puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&depFileStream,pcVar6,
               pcVar6 + (pcVar3->EmptyRuleHackDepends)._M_string_length);
    if (depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ != 0)
    {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&depFileStream
                );
    }
    if (depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
        _vptr_basic_ostream != (_func_int **)puVar1) {
      operator_delete(depFileStream.super_ofstream.
                      super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                      depFileStream.super_ofstream.
                      super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
    }
  }
  pcVar4 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pcVar2 = (this->super_cmMakefileTargetGenerator).BuildFileStream._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  cmLocalUnixMakefileGenerator3::WriteMakeRule
            (pcVar4,(ostream *)pcVar2,(char *)0x0,psVar9,&depends,&commands,true,false);
  psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  cmMakefileTargetGenerator::WriteTargetDriverRule
            (&this->super_cmMakefileTargetGenerator,psVar9,false);
  cmMakefileTargetGenerator::WriteTargetCleanRules(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetDependRules(&this->super_cmMakefileTargetGenerator);
  (*(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
    _vptr_cmCommonTargetGenerator[5])(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dependTimestamp._M_dataplus._M_p != &dependTimestamp.field_2) {
    operator_delete(dependTimestamp._M_dataplus._M_p,
                    dependTimestamp.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dependFile._M_dataplus._M_p != &dependFile.field_2) {
    operator_delete(dependFile._M_dataplus._M_p,dependFile.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileUtilityTargetGenerator::WriteRuleFiles()
{
  this->CreateRuleFile();

  *this->BuildFileStream << "# Utility rule file for "
                         << this->GeneratorTarget->GetName() << ".\n\n";

  const char* root = (this->Makefile->IsOn("CMAKE_MAKE_INCLUDE_FROM_ROOT")
                        ? "$(CMAKE_BINARY_DIR)/"
                        : "");

  // Include the dependencies for the target.
  std::string dependFile =
    cmStrCat(this->TargetBuildDirectoryFull, "/compiler_depend.make");
  *this->BuildFileStream
    << "# Include any custom commands dependencies for this target.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << cmSystemTools::ConvertToOutputPath(
         this->LocalGenerator->MaybeRelativeToTopBinDir(dependFile))
    << "\n\n";
  if (!cmSystemTools::FileExists(dependFile)) {
    // Write an empty dependency file.
    cmGeneratedFileStream depFileStream(
      dependFile, false, this->GlobalGenerator->GetMakefileEncoding());
    depFileStream << "# Empty custom commands generated dependencies file for "
                  << this->GeneratorTarget->GetName() << ".\n"
                  << "# This may be replaced when dependencies are built.\n";
  }

  std::string dependTimestamp =
    cmStrCat(this->TargetBuildDirectoryFull, "/compiler_depend.ts");
  if (!cmSystemTools::FileExists(dependTimestamp)) {
    // Write a dependency timestamp file.
    cmGeneratedFileStream depFileStream(
      dependTimestamp, false, this->GlobalGenerator->GetMakefileEncoding());
    depFileStream << "# CMAKE generated file: DO NOT EDIT!\n"
                  << "# Timestamp file for custom commands dependencies "
                     "management for "
                  << this->GeneratorTarget->GetName() << ".\n";
  }

  if (!this->NoRuleMessages) {
    // Include the progress variables for the target.
    *this->BuildFileStream
      << "# Include the progress variables for this target.\n"
      << this->GlobalGenerator->IncludeDirective << " " << root
      << cmSystemTools::ConvertToOutputPath(
           this->LocalGenerator->MaybeRelativeToTopBinDir(
             this->ProgressFileNameFull))
      << "\n\n";
  }

  // write the custom commands for this target
  this->WriteTargetBuildRules();

  // Collect the commands and dependencies.
  std::vector<std::string> commands;
  std::vector<std::string> depends;

  // Utility targets store their rules in pre- and post-build commands.
  this->LocalGenerator->AppendCustomDepends(
    depends, this->GeneratorTarget->GetPreBuildCommands());

  this->LocalGenerator->AppendCustomDepends(
    depends, this->GeneratorTarget->GetPostBuildCommands());

  this->LocalGenerator->AppendCustomCommands(
    commands, this->GeneratorTarget->GetPreBuildCommands(),
    this->GeneratorTarget, this->LocalGenerator->GetBinaryDirectory());

  // Depend on all custom command outputs for sources
  this->DriveCustomCommands(depends);

  this->LocalGenerator->AppendCustomCommands(
    commands, this->GeneratorTarget->GetPostBuildCommands(),
    this->GeneratorTarget, this->LocalGenerator->GetBinaryDirectory());

  // Add dependencies on targets that must be built first.
  this->AppendTargetDepends(depends);

  // Add a dependency on the rule file itself.
  this->LocalGenerator->AppendRuleDepend(depends,
                                         this->BuildFileNameFull.c_str());

  // If the rule is empty add the special empty rule dependency needed
  // by some make tools.
  if (depends.empty() && commands.empty()) {
    std::string hack = this->GlobalGenerator->GetEmptyRuleHackDepends();
    if (!hack.empty()) {
      depends.push_back(std::move(hack));
    }
  }

  // Write the rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, nullptr,
                                      this->GeneratorTarget->GetName(),
                                      depends, commands, true);

  // Write the main driver rule to build everything in this target.
  this->WriteTargetDriverRule(this->GeneratorTarget->GetName(), false);

  // Write clean target
  this->WriteTargetCleanRules();

  // Write the dependency generation rule.  This must be done last so
  // that multiple output pair information is available.
  this->WriteTargetDependRules();

  // close the streams
  this->CloseFileStreams();
}